

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

bool SetRange(FRemapTable *table,int start,int end,int first,int last)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  if (end - start == 0) {
    uVar2 = (uint)(last + first) >> 1;
    table->Remap[(uint)start] = GPalette.Remap[uVar2];
    bVar4 = uVar2 == start;
    table->Palette[(uint)start].field_0 = GPalette.BaseColors[table->Remap[(uint)start]].field_0;
    table->Palette[(uint)start].field_0.field_0.a = 0xff;
  }
  else {
    bVar4 = true;
    iVar3 = 0;
    for (uVar1 = (ulong)(uint)start; (int)uVar1 <= end; uVar1 = uVar1 + 1) {
      uVar2 = iVar3 / (end - start) + first;
      table->Remap[uVar1] = GPalette.Remap[(int)uVar2];
      bVar4 = bVar4 != false && uVar1 == uVar2;
      table->Palette[uVar1].field_0 = GPalette.BaseColors[table->Remap[uVar1]].field_0;
      table->Palette[uVar1].field_0.field_0.a = 0xff;
      iVar3 = iVar3 + (last - first);
    }
  }
  return bVar4;
}

Assistant:

static bool SetRange(FRemapTable *table, int start, int end, int first, int last)
{
	bool identity = true;
	if (start == end)
	{
		int pi = (first + last) / 2;
		table->Remap[start] = GPalette.Remap[pi];
		identity &= (pi == start);
		table->Palette[start] = GPalette.BaseColors[table->Remap[start]];
		table->Palette[start].a = 255;
	}
	else
	{
		int palrange = last - first;
		for (int i = start; i <= end; ++i)
		{
			int pi = first + palrange * (i - start) / (end - start);
			table->Remap[i] = GPalette.Remap[pi];
			identity &= (pi == i);
			table->Palette[i] = GPalette.BaseColors[table->Remap[i]];
			table->Palette[i].a = 255;
		}
	}
	return identity;
}